

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O0

double Corrade::Utility::Implementation::FloatConfigurationValue<double>::fromString
                 (string *stringValue,ConfigurationValueFlags flags)

{
  bool bVar1;
  ulong uVar2;
  double local_1c0;
  double value;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1a2;
  EnumSet local_1a1;
  long local_1a0;
  istringstream stream;
  string *stringValue_local;
  double dStack_10;
  ConfigurationValueFlags flags_local;
  
  stringValue_local._7_1_ = flags._value;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&local_1a0,stringValue,8);
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_1a2,Scientific);
    local_1a1 = (EnumSet)Containers::
                         EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                         operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                    *)((long)&stringValue_local + 7),local_1a2);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_1a1);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)),
                          _S_scientific,_S_floatfield);
    }
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> *)
               ((long)&value + 2),Uppercase);
    value._3_1_ = Containers::
                  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                  operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                             *)((long)&stringValue_local + 7),value._2_1_);
    bVar1 = Containers::EnumSet::operator_cast_to_bool((EnumSet *)((long)&value + 3));
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)),_S_uppercase
                         );
    }
    std::istream::operator>>(&local_1a0,&local_1c0);
    dStack_10 = local_1c0;
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a0);
  }
  else {
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

T FloatConfigurationValue<T>::fromString(const std::string& stringValue, ConfigurationValueFlags flags) {
        if(stringValue.empty()) return T{};

        std::istringstream stream{stringValue};

        /* Scientific notation */
        if(flags & ConfigurationValueFlag::Scientific)
            stream.setf(std::istringstream::scientific, std::istringstream::floatfield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        T value;
        stream >> value;
        return value;
    }